

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall Map::eachScene(Map *this,SceneStrategy *strategy)

{
  pointer ppSVar1;
  pointer ppSVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"class:Map method:eachScene\n",0x1b);
  ppSVar1 = (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppSVar2 = (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppSVar2 != ppSVar1; ppSVar2 = ppSVar2 + 1) {
    (*(code *)**(undefined8 **)strategy)(strategy,*ppSVar2);
  }
  return;
}

Assistant:

void Map::eachScene(SceneStrategy *strategy) {
    std::cout << "class:Map method:eachScene\n";
    for (auto i : scenes) {
        strategy->act(i);
    }
}